

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_atomize(char *expr,lys_node *cur_snode,lyxp_node_type cur_snode_type,lyxp_set *set,
                int options)

{
  lyxp_expr *exp_00;
  lys_node *cur_node;
  lys_module *plVar1;
  int local_40;
  uint16_t local_3a;
  int rc;
  uint16_t exp_idx;
  lyxp_expr *exp;
  lyxp_set *plStack_28;
  int options_local;
  lyxp_set *set_local;
  lys_node *plStack_18;
  lyxp_node_type cur_snode_type_local;
  lys_node *cur_snode_local;
  char *expr_local;
  
  local_3a = 0;
  exp._4_4_ = options;
  plStack_28 = set;
  set_local._4_4_ = cur_snode_type;
  plStack_18 = cur_snode;
  cur_snode_local = (lys_node *)expr;
  _rc = lyxp_parse_expr(expr);
  if (_rc == (lyxp_expr *)0x0) {
    local_40 = -1;
  }
  else {
    local_40 = reparse_expr(_rc,&local_3a);
    if (local_40 == 0) {
      if (local_3a < _rc->used) {
        ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                _rc->expr + _rc->expr_pos[local_3a]);
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Unparsed characters \"%s\" left at the end of an XPath expression.",
                _rc->expr + _rc->expr_pos[local_3a]);
        local_40 = -1;
      }
      else {
        print_expr_struct_debug(_rc);
        local_3a = 0;
        memset(plStack_28,0,0x30);
        plStack_28->type = LYXP_SET_SNODE_SET;
        set_snode_insert_node(plStack_28,plStack_18,set_local._4_4_);
        cur_node = plStack_18;
        exp_00 = _rc;
        plVar1 = lys_node_module(plStack_18);
        local_40 = eval_expr(exp_00,&local_3a,(lyd_node *)cur_node,plVar1,plStack_28,exp._4_4_);
      }
    }
  }
  lyxp_expr_free(_rc);
  return local_40;
}

Assistant:

int
lyxp_atomize(const char *expr, const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type,
             struct lyxp_set *set, int options)
{
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_expr(exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_SNODE_SET;
    set_snode_insert_node(set, cur_snode, cur_snode_type);

    rc = eval_expr(exp, &exp_idx, (struct lyd_node *)cur_snode, lys_node_module(cur_snode), set, options);

finish:
    lyxp_expr_free(exp);
    return rc;
}